

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::parseInputOrOutputName(StructuralParser *this,EndpointDeclaration *e)

{
  bool bVar1;
  Expression *o;
  EndpointDetails *pEVar2;
  pool_ptr<soul::AST::Expression> local_58;
  char *local_50;
  string *local_48;
  Context local_30;
  EndpointDeclaration *local_18;
  EndpointDeclaration *e_local;
  StructuralParser *this_local;
  
  local_18 = e;
  e_local = (EndpointDeclaration *)this;
  getContext(&local_30,this);
  AST::Context::operator=(&(local_18->super_ASTObject).context,&local_30);
  AST::Context::~Context(&local_30);
  local_48 = (string *)parseIdentifierWithMaxLength(this,0x80);
  (local_18->name).name = local_48;
  local_50 = "[";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x575e01);
  if (bVar1) {
    o = parseExpression(this,false);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_58,o);
    pEVar2 = AST::EndpointDeclaration::getDetails(local_18);
    (pEVar2->arraySize).object = local_58.object;
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_58);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54ace4);
  }
  parseAnnotation(this,&local_18->annotation);
  return;
}

Assistant:

void parseInputOrOutputName (AST::EndpointDeclaration& e)
    {
        e.context = getContext();
        e.name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matchIf (Operator::openBracket))
        {
            e.getDetails().arraySize = parseExpression();
            expect (Operator::closeBracket);
        }

        parseAnnotation (e.annotation);
    }